

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O2

_Bool aa64_generate_debug_exceptions(CPUARMState_conflict *env)

{
  int iVar1;
  uint32_t uVar2;
  int iVar3;
  
  iVar1 = arm_current_el(env);
  if ((iVar1 != 3) &&
     ((((env->features & 0x200000000) == 0 || (((env->cp15).scr_el3 & 1) != 0)) ||
      (uVar2 = extract32((uint32_t)(env->cp15).mdcr_el3,0x10,1), uVar2 == 0)))) {
    iVar3 = arm_debug_target_el(env);
    if (iVar1 != iVar3) {
      return iVar1 < iVar3;
    }
    uVar2 = extract32((uint32_t)(env->cp15).mdscr_el1,0xd,1);
    if (uVar2 != 0) {
      return (env->daif & 0x200) == 0;
    }
  }
  return false;
}

Assistant:

static inline bool aa64_generate_debug_exceptions(CPUARMState *env)
{
    int cur_el = arm_current_el(env);
    int debug_el;

    if (cur_el == 3) {
        return false;
    }

    /* MDCR_EL3.SDD disables debug events from Secure state */
    if (arm_is_secure_below_el3(env)
        && extract32(env->cp15.mdcr_el3, 16, 1)) {
        return false;
    }

    /*
     * Same EL to same EL debug exceptions need MDSCR_KDE enabled
     * while not masking the (D)ebug bit in DAIF.
     */
    debug_el = arm_debug_target_el(env);

    if (cur_el == debug_el) {
        return extract32(env->cp15.mdscr_el1, 13, 1)
            && !(env->daif & PSTATE_D);
    }

    /* Otherwise the debug target needs to be a higher EL */
    return debug_el > cur_el;
}